

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O2

status_t tchecker::dbm::tighten(db_t *dbm,clock_id_t dim,clock_id_t x,clock_id_t y)

{
  uint uVar1;
  db_t dVar2;
  status_t sVar3;
  int iVar4;
  undefined4 in_register_00000014;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  db_t db_ixy;
  db_t local_74;
  ulong local_70;
  ulong local_68;
  db_t *local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_00000034,dim);
  local_40 = CONCAT44(in_register_00000014,x);
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc0,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc1,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  local_38 = (ulong)y;
  uVar1 = x * dim + y;
  if (dbm[uVar1] == (db_t)0x7ffffffe) {
LAB_0013cfa6:
    sVar3 = MAY_BE_EMPTY;
  }
  else {
    local_60 = dbm + uVar1;
    local_50 = (ulong)x;
    local_58 = (ulong)dim;
    local_68 = 0;
    do {
      uVar9 = local_58;
      if (local_68 == local_58) goto LAB_0013cfa6;
      iVar4 = (int)local_68;
      iVar7 = (int)local_48;
      iVar5 = (int)local_38;
      if (local_68 == local_50) {
        uVar6 = (ulong)(uint)(iVar5 + iVar4 * iVar7);
      }
      else {
        db_ixy = sum(dbm + (uint)(iVar4 * iVar7 + (int)local_40),local_60);
        uVar6 = (ulong)(uint)(iVar5 + iVar4 * iVar7);
        bVar10 = operator<(&db_ixy,dbm + uVar6);
        if (bVar10) {
          dbm[uVar6] = db_ixy;
        }
      }
      uVar8 = iVar4 * iVar7;
      uVar1 = y * dim;
      local_70 = local_68;
      while( true ) {
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar10) break;
        local_74 = sum(dbm + uVar6,dbm + uVar1);
        dVar2 = min(dbm + uVar8,&local_74);
        dbm[uVar8] = dVar2;
        uVar1 = uVar1 + 1;
        uVar8 = uVar8 + 1;
      }
      bVar10 = operator<(dbm + (int)local_70 * (dim + 1),(db_t *)&LE_ZERO);
      local_68 = local_68 + 1;
    } while (!bVar10);
    *dbm = (db_t)0x0;
    sVar3 = EMPTY;
  }
  return sVar3;
}

Assistant:

enum tchecker::dbm::status_t tighten(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::clock_id_t x,
                                     tchecker::clock_id_t y)
{
  assert(dbm != nullptr);
  assert(dim >= 1);

  if (DBM(x, y) == tchecker::dbm::LT_INFINITY)
    return tchecker::dbm::MAY_BE_EMPTY;

  for (tchecker::clock_id_t i = 0; i < dim; ++i) {
    // tighten i->y w.r.t. i->x->y
    if (i != x) {
      tchecker::dbm::db_t db_ixy = tchecker::dbm::sum(DBM(i, x), DBM(x, y));
      if (db_ixy < DBM(i, y))
        DBM(i, y) = db_ixy;
    }

    // tighten i->j w.r.t. i->y->j
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::min(DBM(i, j), tchecker::dbm::sum(DBM(i, y), DBM(y, j)));

    if (DBM(i, i) < tchecker::dbm::LE_ZERO) {
      DBM(0, 0) = tchecker::dbm::LT_ZERO;
      return tchecker::dbm::EMPTY;
    }
  }

  return tchecker::dbm::MAY_BE_EMPTY;
}